

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O2

REF_STATUS
ref_egads_edge_face_uv
          (REF_GEOM ref_geom,REF_INT edgeid,REF_INT faceid,REF_INT sense,REF_DBL t,REF_DBL *uv)

{
  printf("No EGADS linked for %s\n",SUB84(t,0),"ref_egads_edge_face_uv");
  *uv = 0.0;
  uv[1] = 0.0;
  return 6;
}

Assistant:

REF_FCN REF_STATUS ref_egads_edge_face_uv(REF_GEOM ref_geom, REF_INT edgeid,
                                          REF_INT faceid, REF_INT sense,
                                          REF_DBL t, REF_DBL *uv) {
#ifdef HAVE_EGADS
  ego *faces, *edges;
  ego face_ego, edge_ego;
  REF_DBL tprime;

  if (NULL != ref_geom_facelift(ref_geom)) {
    RSS(ref_facelift_edge_face_uv(ref_geom_facelift(ref_geom), edgeid, faceid,
                                  sense, t, uv),
        "facelift eval wrapper");
    return REF_SUCCESS;
  }

  RNS(ref_geom->edges, "edges not loaded");
  edges = (ego *)(ref_geom->edges);
  RAS(1 <= edgeid && edgeid <= ref_geom->nedge, "edge id out of range");
  edge_ego = edges[edgeid - 1];

  RNS(ref_geom->faces, "faces not loaded");
  faces = (ego *)(ref_geom->faces);
  RAB(1 <= faceid && faceid <= ref_geom->nface, "face id out of range",
      { printf("edgeid %d faceid %d sense %d\n", edgeid, faceid, sense); });
  face_ego = faces[faceid - 1];

  REIB(EGADS_SUCCESS, EG_getEdgeUV(face_ego, edge_ego, sense, t, uv),
       "eval edge face uv", {
         REF_DBL trange[2];
         printf("faceid %d edgeid %d sense %d t %.18e\n", faceid, edgeid, sense,
                t);
         printf("ref_egads_edge_trange status %d\n",
                ref_egads_edge_trange(ref_geom, edgeid, trange));
         printf("edgeid %d trange %.18e %.18e\n", edgeid, trange[0], trange[1]);
       });

  if (ref_geom_zip_pcurve(ref_geom)) {
    RSS(ref_egads_edge_face_tprime(ref_geom, edgeid, faceid, sense, t, &tprime),
        "tprime");
    REIB(EGADS_SUCCESS, EG_getEdgeUV(face_ego, edge_ego, sense, tprime, uv),
         "eval edge face uv", {
           REF_DBL trange[2];
           printf("faceid %d edgeid %d sense %d t %.18e\n", faceid, edgeid,
                  sense, t);
           printf("ref_egads_edge_trange status %d\n",
                  ref_egads_edge_trange(ref_geom, edgeid, trange));
           printf("edgeid %d trange %.18e %.18e\n", edgeid, trange[0],
                  trange[1]);
         });
  }

  return REF_SUCCESS;
#else
  printf("No EGADS linked for %s\n", __func__);
  SUPRESS_UNUSED_COMPILER_WARNING(ref_geom);
  SUPRESS_UNUSED_COMPILER_WARNING(edgeid);
  SUPRESS_UNUSED_COMPILER_WARNING(faceid);
  SUPRESS_UNUSED_COMPILER_WARNING(sense);
  SUPRESS_UNUSED_COMPILER_WARNING(t);
  uv[0] = 0.0;
  uv[1] = 0.0;
  return REF_IMPLEMENT;
#endif
}